

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  iterator __first;
  iterator __last;
  allocator<char> local_111;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  string local_100 [39];
  allocator<char> local_d9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined1 local_c8 [8];
  string value;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  value_type local_60;
  size_t local_40;
  size_t end;
  size_type bracketLoc;
  undefined1 local_1b;
  anon_class_1_1_06a9eca7_for__M_pred local_1a;
  char local_19;
  anon_class_1_1_06a9eca7_for__M_pred find_ws;
  string *psStack_18;
  char delimiter_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  local_1a.delimiter = delimiter;
  local_19 = delimiter;
  psStack_18 = str;
  trim(str);
  local_1b = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while (bVar1 = ::std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    lVar4 = ::std::__cxx11::string::find_first_of('\x18',(ulong)(uint)(int)*pcVar3);
    if (lVar4 == -1) {
      __first = ::std::begin<std::__cxx11::string>(str);
      __last = ::std::end<std::__cxx11::string>(str);
      local_88 = ::std::
                 find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>
                           (__first._M_current,__last._M_current,local_1a);
      value.field_2._8_8_ = ::std::end<std::__cxx11::string>(str);
      bVar2 = __gnu_cxx::operator!=
                        (&local_88,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&value.field_2 + 8));
      if (bVar2) {
        local_d0._M_current = (char *)::std::__cxx11::string::begin();
        local_d8._M_current = local_88._M_current;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)local_c8,local_d0,local_d8,&local_d9);
        ::std::allocator<char>::~allocator(&local_d9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_c8);
        local_108 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_88,1);
        local_110._M_current = (char *)::std::__cxx11::string::end();
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (local_100,local_108,local_110,&local_111);
        ::std::__cxx11::string::operator=((string *)str,local_100);
        ::std::__cxx11::string::~string(local_100);
        ::std::allocator<char>::~allocator(&local_111);
        ::std::__cxx11::string::~string((string *)local_c8);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::clear();
      }
    }
    else {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      end = ::std::__cxx11::string::find_first_of('\x18',(ulong)(uint)(int)*pcVar3);
      pcVar3 = (char *)::std::__cxx11::string::operator[](0x180538);
      sVar5 = close_sequence(str,0,*pcVar3);
      local_40 = sVar5;
      uVar6 = ::std::__cxx11::string::size();
      if (sVar5 < uVar6) {
        ::std::__cxx11::string::substr((ulong)&local_60,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        uVar6 = local_40 + 2;
        uVar7 = ::std::__cxx11::string::size();
        if (uVar6 < uVar7) {
          ::std::__cxx11::string::substr((ulong)&it,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&it);
          ::std::__cxx11::string::~string((string *)&it);
        }
        else {
          ::std::__cxx11::string::clear();
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::clear();
      }
    }
    trim(str);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<std::string> split_up(std::string str, char delimiter) {

    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? std::isspace<char>(ch, std::locale()) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    while(!str.empty()) {
        if(bracketChars.find_first_of(str[0]) != std::string::npos) {
            auto bracketLoc = bracketChars.find_first_of(str[0]);
            auto end = close_sequence(str, 0, matchBracketChars[bracketLoc]);
            if(end >= str.size()) {
                output.push_back(std::move(str));
                str.clear();
            } else {
                output.push_back(str.substr(0, end + 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str.clear();
            }
        }
        trim(str);
    }
    return output;
}